

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  IUINT32 *pIVar1;
  IQUEUEHEAD *pIVar2;
  byte bVar3;
  byte bVar4;
  IUINT32 IVar5;
  uint uVar6;
  IUINT32 IVar7;
  IQUEUEHEAD *pIVar8;
  IUINT32 *__ptr;
  long lVar9;
  bool bVar10;
  IUINT32 IVar11;
  IUINT32 *pIVar12;
  IQUEUEHEAD *pIVar13;
  IKCPSEG *newseg;
  uint uVar14;
  int iVar15;
  IKCPSEG *seg;
  ulong __n;
  IQUEUEHEAD *pIVar16;
  uint uVar17;
  IUINT32 IVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  int local_68;
  uint local_58;
  
  IVar5 = kcp->snd_una;
  if (((kcp->logmask & 2) != 0) && (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)
     ) {
    ikcp_log(kcp,2,"[RI] %d bytes",size);
  }
  if ((int)size < 0x18 || data == (char *)0x0) {
LAB_0014bde4:
    local_68 = -1;
  }
  else {
    if (size < 0x18) {
      IVar11 = kcp->snd_una;
    }
    else {
      pIVar2 = &kcp->snd_buf;
      pIVar1 = &kcp->snd_nxt;
      bVar10 = false;
      local_58 = 0;
      do {
        IVar11 = *(IUINT32 *)data;
        if (IVar11 != kcp->conv) goto LAB_0014bde4;
        uVar14 = *(uint *)((long)data + 0x14);
        __n = (ulong)uVar14;
        uVar23 = size - 0x18;
        size = uVar23 - __n;
        if (uVar23 < __n) {
          return -2;
        }
        bVar3 = (byte)*(IUINT32 *)((long)data + 4);
        if ((byte)(bVar3 + 0xab) < 0xfc) {
          return -3;
        }
        bVar4 = *(byte *)((long)data + 5);
        uVar21 = *(uint *)((long)data + 8);
        uVar6 = *(uint *)((long)data + 0xc);
        IVar7 = *(IUINT32 *)((long)data + 0x10);
        uVar17 = (uint)*(ushort *)((long)data + 6);
        kcp->rmt_wnd = uVar17;
        pIVar16 = (kcp->snd_buf).next;
        if (pIVar16 != pIVar2) {
          do {
            if ((int)(IVar7 - *(int *)((long)&pIVar16[2].next + 4)) < 1) break;
            pIVar13 = pIVar16->next;
            pIVar8 = pIVar16->prev;
            pIVar13->prev = pIVar8;
            pIVar8->next = pIVar13;
            pIVar16->next = (IQUEUEHEAD *)0x0;
            pIVar16->prev = (IQUEUEHEAD *)0x0;
            if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
              free(pIVar16);
            }
            else {
              (*ikcp_free_hook)(pIVar16);
            }
            kcp->nsnd_buf = kcp->nsnd_buf - 1;
            pIVar16 = pIVar13;
          } while (pIVar13 != pIVar2);
          pIVar16 = pIVar2->next;
        }
        pIVar12 = (IUINT32 *)((long)&pIVar16[2].next + 4);
        if (pIVar16 == pIVar2) {
          pIVar12 = pIVar1;
        }
        IVar18 = *pIVar12;
        kcp->snd_una = IVar18;
        if (3 < bVar3 - 0x51) {
          return -3;
        }
        switch((uint)bVar3) {
        case 0x51:
          if (((kcp->logmask & 0x10) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x10,"input psh: sn=%lu ts=%lu",(ulong)uVar6,(ulong)uVar21);
          }
          if ((int)(uVar6 - (kcp->rcv_nxt + kcp->rcv_wnd)) < 0) {
            IVar18 = kcp->ackcount;
            if (kcp->ackblock < IVar18 + 1) {
              uVar23 = 8;
              do {
                uVar22 = uVar23;
                uVar23 = uVar22 * 2;
              } while (uVar22 < IVar18 + 1);
              if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                pIVar12 = (IUINT32 *)malloc(uVar22 * 8);
              }
              else {
                pIVar12 = (IUINT32 *)(*ikcp_malloc_hook)(uVar22 * 8);
              }
              if (pIVar12 == (IUINT32 *)0x0) {
                __assert_fail("acklist != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/net_uv/kcp/ikcp.c"
                              ,0x283,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
              }
              __ptr = kcp->acklist;
              if (__ptr != (IUINT32 *)0x0) {
                if (kcp->ackcount != 0) {
                  uVar23 = 0;
                  do {
                    pIVar12[uVar23 * 2] = __ptr[uVar23 * 2];
                    pIVar12[uVar23 * 2 + 1] = __ptr[uVar23 * 2 + 1];
                    uVar23 = uVar23 + 1;
                  } while (uVar23 < kcp->ackcount);
                }
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(__ptr);
                }
                else {
                  (*ikcp_free_hook)(__ptr);
                }
              }
              kcp->acklist = pIVar12;
              kcp->ackblock = (IUINT32)uVar22;
              IVar18 = kcp->ackcount;
            }
            else {
              pIVar12 = kcp->acklist;
            }
            pIVar12[IVar18 * 2] = uVar6;
            pIVar12[(ulong)(IVar18 * 2) + 1] = uVar21;
            kcp->ackcount = kcp->ackcount + 1;
            if (-1 < (int)(uVar6 - kcp->rcv_nxt)) {
              if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                newseg = (IKCPSEG *)malloc((long)(int)uVar14 + 0x48U);
              }
              else {
                newseg = (IKCPSEG *)(*ikcp_malloc_hook)((long)(int)uVar14 + 0x48U);
              }
              newseg->conv = IVar11;
              newseg->cmd = 0x51;
              newseg->frg = (uint)bVar4;
              newseg->wnd = uVar17;
              newseg->ts = uVar21;
              newseg->sn = uVar6;
              newseg->una = IVar7;
              newseg->len = uVar14;
              if (uVar14 != 0) {
                memcpy(newseg->data,(IUINT32 *)((long)data + 0x18),__n);
              }
              ikcp_parse_data(kcp,newseg);
            }
          }
          break;
        case 0x52:
          uVar14 = kcp->current - uVar21;
          if (-1 < (int)uVar14) {
            iVar15 = kcp->rx_srtt;
            if (iVar15 == 0) {
              kcp->rx_srtt = uVar14;
              uVar17 = uVar14 >> 1;
              kcp->rx_rttval = uVar17;
            }
            else {
              uVar19 = uVar14 - iVar15;
              uVar17 = -uVar19;
              if (0 < (int)uVar19) {
                uVar17 = uVar19;
              }
              lVar9 = (long)kcp->rx_rttval * 3;
              uVar22 = lVar9 + (ulong)uVar17;
              uVar23 = (ulong)uVar17 + lVar9 + 3;
              if (-1 < (long)uVar22) {
                uVar23 = uVar22;
              }
              uVar17 = (uint)(uVar23 >> 2);
              kcp->rx_rttval = uVar17;
              iVar20 = iVar15 * 7 + uVar14;
              iVar15 = iVar15 * 7 + 7 + uVar14;
              if (-1 < iVar20) {
                iVar15 = iVar20;
              }
              uVar14 = iVar15 >> 3;
              if (iVar20 < 8) {
                uVar14 = 1;
              }
              kcp->rx_srtt = uVar14;
            }
            uVar19 = uVar17 * 4;
            if (uVar17 * 4 < kcp->interval) {
              uVar19 = kcp->interval;
            }
            uVar17 = uVar19 + uVar14;
            if (uVar19 + uVar14 < (uint)kcp->rx_minrto) {
              uVar17 = kcp->rx_minrto;
            }
            if (59999 < uVar17) {
              uVar17 = 60000;
            }
            kcp->rx_rto = uVar17;
          }
          if ((-1 < (int)(uVar6 - IVar18)) && (pIVar13 = pIVar16, (int)(uVar6 - *pIVar1) < 0)) {
            do {
              if (pIVar13 == pIVar2) break;
              pIVar8 = pIVar13->next;
              uVar14 = *(uint *)((long)&pIVar13[2].next + 4);
              if (uVar6 == uVar14) {
                pIVar16 = pIVar13->prev;
                pIVar8->prev = pIVar16;
                pIVar16->next = pIVar8;
                pIVar13->next = (IQUEUEHEAD *)0x0;
                pIVar13->prev = (IQUEUEHEAD *)0x0;
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(pIVar13);
                }
                else {
                  (*ikcp_free_hook)(pIVar13);
                }
                kcp->nsnd_buf = kcp->nsnd_buf - 1;
                pIVar16 = (kcp->snd_buf).next;
                break;
              }
              pIVar13 = pIVar8;
            } while (-1 < (int)(uVar6 - uVar14));
          }
          pIVar12 = (IUINT32 *)((long)&pIVar16[2].next + 4);
          if (pIVar16 == pIVar2) {
            pIVar12 = pIVar1;
          }
          if (0 < (int)(uVar6 - local_58)) {
            local_58 = uVar6;
          }
          if (!bVar10) {
            local_58 = uVar6;
          }
          kcp->snd_una = *pIVar12;
          bVar10 = true;
          if (((kcp->logmask & 0x20) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x10,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)uVar6,
                     (long)(int)(kcp->current - uVar21),(long)kcp->rx_rto);
          }
          break;
        case 0x53:
          *(byte *)&kcp->probe = (byte)kcp->probe | 2;
          if (((kcp->logmask & 0x40) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x40,"input probe");
          }
          break;
        case 0x54:
          if (((kcp->logmask & 0x80) != 0) &&
             (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
            ikcp_log(kcp,0x80,"input wins: %lu",(ulong)uVar17);
          }
        }
        data = (char *)((long)data + 0x18 + __n);
      } while (0x17 < size);
      IVar11 = kcp->snd_una;
      if (((bVar10) && (-1 < (int)(local_58 - IVar11))) && ((int)(local_58 - kcp->snd_nxt) < 0)) {
        pIVar16 = (kcp->snd_buf).next;
        while ((pIVar16 != pIVar2 &&
               (uVar14 = *(uint *)((long)&pIVar16[2].next + 4), -1 < (int)(local_58 - uVar14)))) {
          if (local_58 != uVar14) {
            *(int *)&pIVar16[3].prev = *(int *)&pIVar16[3].prev + 1;
          }
          pIVar16 = pIVar16->next;
        }
      }
    }
    if (0 < (int)(IVar11 - IVar5)) {
      uVar14 = kcp->rmt_wnd;
      uVar21 = kcp->cwnd;
      if (uVar21 < uVar14) {
        uVar6 = kcp->mss;
        if (uVar21 < kcp->ssthresh) {
          kcp->cwnd = uVar21 + 1;
          kcp->incr = kcp->incr + uVar6;
          uVar21 = uVar21 + 1;
        }
        else {
          uVar17 = kcp->incr;
          if (kcp->incr <= uVar6) {
            uVar17 = uVar6;
          }
          uVar19 = (uVar6 >> 4) + uVar17 + (uVar6 * uVar6) / uVar17;
          kcp->incr = uVar19;
          uVar17 = uVar21 + 1;
          if (uVar6 * uVar17 <= uVar19) {
            kcp->cwnd = uVar17;
            uVar21 = uVar17;
          }
        }
        if (uVar21 <= uVar14) {
          return 0;
        }
        kcp->cwnd = uVar14;
        kcp->incr = uVar6 * uVar14;
        return 0;
      }
    }
    local_68 = 0;
  }
  return local_68;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 una = kcp->snd_una;
	IUINT32 maxack = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
					maxack = sn;
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input ack: sn=%lu rtt=%ld rto=%ld", sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", sn, ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (IUINT32)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack);
	}

	if (_itimediff(kcp->snd_una, una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
					kcp->cwnd++;
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}